

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateLdFuncObjProto(Lowerer *this,Instr *instr)

{
  Func *func_00;
  Opnd *src;
  LabelInstr *labelReturnTrue;
  LabelInstr *labelReturnNullptr;
  RegOpnd *instanceRegOpnd_00;
  Opnd *dst;
  Opnd *dstOpnd;
  RegOpnd *instanceRegOpnd;
  LabelInstr *helperLabelThrowTypeError;
  LabelInstr *labelDone;
  Opnd *src1Opnd;
  Func *func;
  Instr *instr_local;
  Lowerer *this_local;
  
  func_00 = instr->m_func;
  src = IR::Instr::UnlinkSrc1(instr);
  labelReturnTrue = IR::LabelInstr::New(Label,func_00,false);
  labelReturnNullptr = IR::LabelInstr::New(Label,func_00,false);
  instanceRegOpnd_00 = IR::RegOpnd::New(TyUint64,func_00);
  dst = IR::Instr::GetDst(instr);
  InsertMove(&instanceRegOpnd_00->super_Opnd,src,instr,true);
  GenerateRecyclableObjectGetPrototypeNullptrGoto(this,instr,instanceRegOpnd_00,labelReturnNullptr);
  InsertMove(dst,&instanceRegOpnd_00->super_Opnd,instr,true);
  GenerateJavascriptOperatorsIsConstructorGotoElse
            (this,instr,instanceRegOpnd_00,labelReturnTrue,labelReturnNullptr);
  IR::Instr::InsertBefore(instr,&labelReturnNullptr->super_Instr);
  GenerateRuntimeError(this,instr,-0x7ff5ec00,HelperOp_RuntimeTypeError);
  IR::Instr::InsertBefore(instr,&labelReturnTrue->super_Instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateLdFuncObjProto(IR::Instr* instr)
{
    //  MOV instance, src1
    //
    //  instance = ((RecyclableObject*)instance)->GetPrototype();
    //  if (instance == nullptr) goto $ThrowTypeError;
    //
    //  MOV dst, instance
    //
    //  if (!JavascriptOperators::IsConstructor(instance))
    //     goto $ThrowTypeError;
    //  else
    //     goto $Done;
    //
    //  $helperLabelThrowTypeError:
    //  ThrowRuntimeTypeError(JSERR_NotAConstructor);
    //
    //  $Done:

    Func *func = instr->m_func;
    IR::Opnd *src1Opnd = instr->UnlinkSrc1();

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *helperLabelThrowTypeError = IR::LabelInstr::New(Js::OpCode::Label, func, false);

    IR::RegOpnd *instanceRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    IR::Opnd *dstOpnd = instr->GetDst();

    Lowerer::InsertMove(instanceRegOpnd, src1Opnd, instr);

    this->GenerateRecyclableObjectGetPrototypeNullptrGoto(instr, instanceRegOpnd, helperLabelThrowTypeError);

    Lowerer::InsertMove(dstOpnd, instanceRegOpnd, instr);

    this->GenerateJavascriptOperatorsIsConstructorGotoElse(instr, instanceRegOpnd, labelDone, helperLabelThrowTypeError);

    instr->InsertBefore(helperLabelThrowTypeError);
    this->GenerateRuntimeError(instr, JSERR_NotAConstructor, IR::HelperOp_RuntimeTypeError);

    instr->InsertBefore(labelDone);
    instr->Remove();
}